

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O3

int UnsignedShort_UnsignedTest_Test::AddToRegistry(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<UnsignedShort> *this_01;
  TestMetaFactoryBase<unsigned_short> *meta_factory;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  CodeLocation local_80;
  CodeLocation local_58;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,"");
  paVar2 = &local_58.file.field_2;
  local_58.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_a0,local_98 + (long)local_a0);
  local_58.line = 0xe4;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<UnsignedShort>(this_00,"UnsignedShort",&local_58);
  meta_factory = (TestMetaFactoryBase<unsigned_short> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_00235aa0;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,"");
  paVar1 = &local_80.file.field_2;
  local_80.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_c0,local_b8 + (long)local_c0);
  local_80.line = 0xe4;
  testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::AddTestPattern
            (this_01,"UnsignedShort","UnsignedTest",meta_factory,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.file._M_dataplus._M_p,local_80.file.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return 0;
}

Assistant:

TEST_P (UnsignedShort, UnsignedTest) {
    SCOPED_TRACE ("UnsignedShort");
    check (GetParam ());
}